

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2R.cpp
# Opt level: O2

void __thiscall
OpenMD::P2Z::P2Z(P2Z *this,SimInfo *info,string *filename,string *sele1,int seleOffset,uint nbins,
                int axis)

{
  stringstream params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [12];
  
  P2R::P2R(&this->super_P2R,info,filename,sele1,seleOffset,nbins);
  (this->super_P2R).super_StaticAnalyser._vptr_StaticAnalyser = (_func_int **)&PTR__P2Z_002ee108;
  *(int *)&(this->super_P2R).field_0xd64 = axis;
  (this->axisLabel_)._M_dataplus._M_p = (pointer)&(this->axisLabel_).field_2;
  (this->axisLabel_)._M_string_length = 0;
  (this->axisLabel_).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&this->axisLabel_);
  std::operator+(&bStack_1c8,"2nd order Legendre Polynomial Correlation using ",&this->axisLabel_);
  std::operator+(local_1a8,&bStack_1c8," as reference axis");
  std::__cxx11::string::_M_assign((string *)&(this->super_P2R).super_StaticAnalyser.analysisType_);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)&bStack_1c8);
  getPrefix(&bStack_1c8,filename);
  std::operator+(local_1a8,&bStack_1c8,".P2Z");
  std::__cxx11::string::_M_assign((string *)&(this->super_P2R).super_StaticAnalyser.outputFilename_)
  ;
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)&bStack_1c8);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_P2R).super_StaticAnalyser.paramString_);
  std::__cxx11::string::~string((string *)&bStack_1c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  return;
}

Assistant:

P2Z::P2Z(SimInfo* info, const std::string& filename, const std::string& sele1,
           int seleOffset, unsigned int nbins, int axis) :
      P2R(info, filename, sele1, seleOffset, nbins),
      axis_(axis) {
    switch (axis_) {
    case 0:
      axisLabel_ = "x";
      break;
    case 1:
      axisLabel_ = "y";
      break;
    case 2:
    default:
      axisLabel_ = "z";
      break;
    }

    setAnalysisType("2nd order Legendre Polynomial Correlation using " +
                    axisLabel_ + " as reference axis");
    setOutputName(getPrefix(filename) + ".P2Z");
    std::stringstream params;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }